

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::Descriptor::DebugStringWithOptions_abi_cxx11_
          (Descriptor *this,DebugStringOptions *options)

{
  string *in_RDI;
  string *contents;
  undefined1 in_stack_00001857;
  DebugStringOptions *in_stack_00001858;
  string *in_stack_00001860;
  int in_stack_0000186c;
  Descriptor *in_stack_00001870;
  
  std::__cxx11::string::string((string *)in_RDI);
  DebugString(in_stack_00001870,in_stack_0000186c,in_stack_00001860,in_stack_00001858,
              (bool)in_stack_00001857);
  return in_RDI;
}

Assistant:

std::string Descriptor::DebugStringWithOptions(
    const DebugStringOptions& options) const {
  std::string contents;
  DebugString(0, &contents, options, /* include_opening_clause */ true);
  return contents;
}